

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s1;
  long lVar1;
  int iVar2;
  undefined8 *in_RSI;
  int in_EDI;
  DataReaderFromEmpty dr;
  bool s2;
  NetQuantize quantizer;
  char *int8scale_table_path;
  char *outbin;
  char *outparam;
  char *inbin;
  char *inparam;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *in_stack_00000248;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *in_stack_00000250;
  char *in_stack_00000258;
  NetQuantize *in_stack_000002e8;
  NetQuantize *in_stack_00000348;
  char *in_stack_00000a80;
  char *in_stack_00000a88;
  ModelWriter *in_stack_00000a90;
  NetQuantize *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  DataReader *in_stack_ffffffffffffff90;
  Net *in_stack_ffffffffffffff98;
  int local_4;
  
  if (in_EDI == 6) {
    __s1 = (char *)in_RSI[2];
    lVar1 = in_RSI[5];
    NetQuantize::NetQuantize(in_stack_fffffffffffffed0);
    if ((lVar1 == 0) ||
       (in_stack_fffffffffffffeef =
             read_int8scale_table(in_stack_00000258,in_stack_00000250,in_stack_00000248),
       (bool)in_stack_fffffffffffffeef)) {
      ncnn::Net::load_param
                ((Net *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee0);
      iVar2 = strcmp(__s1,"null");
      if (iVar2 == 0) {
        DataReaderFromEmpty::DataReaderFromEmpty((DataReaderFromEmpty *)in_stack_fffffffffffffed0);
        ncnn::Net::load_model(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        DataReaderFromEmpty::~DataReaderFromEmpty((DataReaderFromEmpty *)0x17f8bf);
      }
      else {
        ncnn::Net::load_model
                  ((Net *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                   in_stack_fffffffffffffee0);
      }
      NetQuantize::quantize_convolution(in_stack_000002e8);
      NetQuantize::quantize_convolutiondepthwise(in_stack_00000348);
      NetQuantize::quantize_innerproduct(in_stack_000002e8);
      NetQuantize::fuse_requantize((NetQuantize *)quantizer.super_ModelWriter.super_Net.d);
      ModelWriter::save(in_stack_00000a90,in_stack_00000a88,in_stack_00000a80);
      local_4 = 0;
    }
    else {
      fprintf(_stderr,"read_int8scale_table failed\n");
      local_4 = -1;
    }
    NetQuantize::~NetQuantize(in_stack_fffffffffffffed0);
  }
  else {
    fprintf(_stderr,"usage: %s [inparam] [inbin] [outparam] [outbin] [calibration table]\n",*in_RSI)
    ;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 6)
    {
        fprintf(stderr, "usage: %s [inparam] [inbin] [outparam] [outbin] [calibration table]\n", argv[0]);
        return -1;
    }

    const char* inparam = argv[1];
    const char* inbin = argv[2];
    const char* outparam = argv[3];
    const char* outbin = argv[4];
    const char* int8scale_table_path = argv[5];

    NetQuantize quantizer;

    // parse the calibration scale table
    if (int8scale_table_path)
    {
        bool s2 = read_int8scale_table(int8scale_table_path, quantizer.blob_int8scale_table, quantizer.weight_int8scale_table);
        if (!s2)
        {
            fprintf(stderr, "read_int8scale_table failed\n");
            return -1;
        }
    }

    quantizer.load_param(inparam);
    if (strcmp(inbin, "null") == 0)
    {
        DataReaderFromEmpty dr;
        quantizer.load_model(dr);
        quantizer.gen_random_weight = true;
    }
    else
        quantizer.load_model(inbin);

    quantizer.quantize_convolution();
    quantizer.quantize_convolutiondepthwise();
    quantizer.quantize_innerproduct();

    quantizer.fuse_requantize();

    quantizer.save(outparam, outbin);

    return 0;
}